

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

double helicsInputGetDouble(HelicsInput inp,HelicsError *err)

{
  HelicsInput pvVar1;
  double val;
  double local_10;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a9145;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a9147;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a9145:
  pvVar1 = (HelicsInput)0x0;
LAB_001a9147:
  if (pvVar1 == (HelicsInput)0x0) {
    local_10 = -1e+49;
  }
  else {
    helics::Input::getValue_impl<double>(*(Input **)((long)pvVar1 + 0x18),&local_10);
  }
  return local_10;
}

Assistant:

double helicsInputGetDouble(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_INVALID_DOUBLE;
    }
    try {
        return inpObj->inputPtr->getValue<double>();
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_INVALID_DOUBLE;
    }
}